

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O3

void CVmObjBigNum::compute_quotient_into(char *new_ext,char *new_rem_ext,char *ext1,char *ext2)

{
  byte *pbVar1;
  ushort uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  char *pcVar9;
  ushort *ext;
  err_frame_t *peVar10;
  CVmException *pCVar11;
  int16_t tmp_1;
  int iVar12;
  int iVar13;
  uint uVar14;
  char *pcVar15;
  ulong uVar16;
  ushort *puVar17;
  char *pcVar18;
  byte bVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  uint pair;
  uint uVar25;
  int iVar26;
  int iVar27;
  int16_t tmp_2;
  ulong uVar28;
  long *in_FS_OFFSET;
  uint uVar37;
  undefined1 in_XMM3 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined4 uVar38;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  char *rem_ext;
  ushort local_172;
  char *rem_ext2;
  char *dvs_ext;
  uint dvs_hdl2;
  uint rem_hdl2;
  uint rem_hdl;
  char *local_150;
  ushort *local_148;
  char *dvs_ext2;
  uint dvs_hdl;
  ulong local_130;
  char *local_128;
  ushort *local_120;
  ulong local_118;
  err_frame_t err_cur__;
  
  if ((ext2[4] & 8U) != 0) {
    err_throw(0x7d8);
  }
  local_118 = (ulong)(uint)*(ushort *)new_ext;
  if ((ext1[4] & 8U) != 0) {
    new_ext[2] = '\x01';
    new_ext[3] = '\0';
    new_ext[4] = new_ext[4] & 0xf0U | 8;
    memset(new_ext + 5,0,(ulong)(*(ushort *)new_ext + 1 >> 1));
    if (new_rem_ext == (char *)0x0) {
      return;
    }
    new_rem_ext[2] = '\x01';
    new_rem_ext[3] = '\0';
    new_rem_ext[4] = new_rem_ext[4] & 0xf0U | 8;
    memset(new_rem_ext + 5,0,(ulong)(*(ushort *)new_rem_ext + 1 >> 1));
    return;
  }
  uVar2 = *(ushort *)ext2;
  uVar14 = (uint)uVar2;
  uVar25 = uVar14;
  if (uVar2 < *(ushort *)ext1) {
    uVar25 = (uint)*(ushort *)ext1;
  }
  local_128 = ext2;
  alloc_temp_regs((ulong)(uVar25 + ((short)uVar25 == 0) & 0xffff) + 2,3,&rem_ext,&rem_hdl,&rem_ext2,
                  &rem_hdl2,&dvs_ext2,&dvs_hdl2);
  local_150 = ext1;
  G_err_frame::__tls_init();
  err_cur__.prv_ = (err_frame_t *)*in_FS_OFFSET;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)&err_cur__;
  err_cur__.state_ = _setjmp((__jmp_buf_tag *)err_cur__.jmpbuf_);
  if (err_cur__.state_ == 0) {
    alloc_temp_regs((ulong)uVar14,1,&dvs_ext,&dvs_hdl);
  }
  local_120 = (ushort *)new_ext;
  if (err_cur__.state_ == 1) {
    err_cur__.state_ = 2;
    release_temp_regs(3,(ulong)rem_hdl,(ulong)rem_hdl2,(ulong)dvs_hdl2);
    err_rethrow();
  }
  peVar10 = err_cur__.prv_;
  G_err_frame::__tls_init();
  *in_FS_OFFSET = (long)peVar10;
  if ((err_cur__.state_ & 0x4001U) != 0) {
    G_err_frame::__tls_init();
    if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
      G_err_frame::__tls_init();
      free(*(void **)(*in_FS_OFFSET + 0x10));
    }
    pCVar11 = err_cur__.exc_;
    G_err_frame::__tls_init();
    *(CVmException **)(*in_FS_OFFSET + 0x10) = pCVar11;
    err_rethrow();
  }
  if ((err_cur__.state_ & 2U) != 0) {
    free(err_cur__.exc_);
  }
  pcVar15 = local_150;
  copy_val(rem_ext,local_150,1);
  pcVar18 = local_128;
  copy_val(dvs_ext,local_128,1);
  puVar17 = local_120;
  iVar12 = (int)*(short *)(pcVar15 + 2) - (int)*(short *)(pcVar18 + 2);
  *(short *)(dvs_ext + 2) = *(short *)(pcVar15 + 2);
  if (-1 < iVar12 || new_rem_ext == (char *)0x0) {
    iVar12 = iVar12 + 1;
    uVar16 = 0;
    uVar28 = uVar16;
    local_172 = uVar2;
    local_148 = (ushort *)new_rem_ext;
    do {
      puVar17 = local_120;
      iVar20 = (uint)((byte)dvs_ext[5] >> 4) * 100;
      if (((ushort)uVar14 < 2) ||
         (iVar20 = iVar20 + ((byte)dvs_ext[5] & 0xf) * 10, (ushort)uVar14 == 2)) {
        uVar25 = 0;
      }
      else {
        uVar25 = (uint)((byte)dvs_ext[6] >> 4);
      }
      iVar13 = (uint)((byte)rem_ext[6] >> 4) + ((byte)rem_ext[5] & 0xf) * 10 +
               (uint)((byte)rem_ext[5] >> 4) * 100;
      iVar20 = uVar25 + iVar20 + 1;
      iVar21 = (int)*(short *)(rem_ext + 2);
      iVar27 = (int)*(short *)(dvs_ext + 2);
      iVar26 = iVar21 - iVar27;
      if (iVar26 == 0 || iVar21 < iVar27) {
        if (iVar26 < -2) {
          iVar20 = 1000;
        }
        else if (iVar26 < 0) {
          uVar25 = (iVar27 - iVar21) - 1;
          auVar8._4_8_ = in_XMM3._8_8_;
          auVar8._0_4_ = 1;
          auVar33._0_8_ = auVar8._0_8_ << 0x20;
          auVar33._8_4_ = 1;
          auVar33._12_4_ = 1;
          auVar34._4_12_ = auVar33._4_12_;
          auVar34._0_4_ = iVar20;
          iVar20 = 4;
          do {
            uVar14 = auVar34._0_4_;
            auVar35._4_4_ = auVar34._4_4_;
            uVar37 = auVar34._8_4_;
            auVar35._12_4_ = auVar34._12_4_;
            iVar6 = uVar14 * 10;
            iVar22 = uVar37 * 10;
            auVar35._0_4_ = auVar35._4_4_;
            auVar35._8_4_ = auVar35._12_4_;
            uVar38 = (undefined4)((auVar35._8_8_ & 0xffffffff) * 10);
            iVar24 = iVar20 + -4;
            iVar26 = ((iVar27 - iVar21) + 3U & 0xfffffffc) + iVar20;
            auVar34._4_4_ = auVar35._4_4_ * 10;
            auVar34._0_4_ = iVar6;
            auVar34._8_4_ = iVar22;
            auVar34._12_4_ = uVar38;
            iVar20 = iVar24;
          } while (iVar26 != 8);
          uVar23 = -iVar24;
          auVar36._0_4_ = -(uint)((int)(uVar25 ^ 0x80000000) < (int)(uVar23 ^ 0x80000000));
          auVar36._4_4_ = -(uint)((int)(uVar25 ^ 0x80000000) < (int)((uVar23 | 1) ^ 0x80000000));
          auVar36._8_4_ = -(uint)((int)(uVar25 ^ 0x80000000) < (int)((uVar23 | 2) ^ 0x80000000));
          auVar36._12_4_ = -(uint)((int)(uVar25 ^ 0x80000000) < (int)((uVar23 | 3) ^ 0x80000000));
          auVar5._4_4_ = auVar35._4_4_ * 10;
          auVar5._0_4_ = iVar6;
          auVar5._8_4_ = iVar22;
          auVar5._12_4_ = uVar38;
          auVar3._4_4_ = auVar35._4_4_ & auVar36._4_4_;
          auVar3._0_4_ = uVar14 & auVar36._0_4_;
          auVar3._8_4_ = uVar37 & auVar36._8_4_;
          auVar3._12_4_ = auVar35._12_4_ & auVar36._12_4_;
          in_XMM3 = ~auVar36 & auVar5 | auVar3;
          iVar20 = in_XMM3._8_4_ * in_XMM3._0_4_ * in_XMM3._4_4_ * in_XMM3._12_4_;
        }
      }
      else {
        uVar25 = iVar26 - 1;
        auVar7._4_8_ = in_XMM3._8_8_;
        auVar7._0_4_ = 1;
        auVar29._0_8_ = auVar7._0_8_ << 0x20;
        auVar29._8_4_ = 1;
        auVar29._12_4_ = 1;
        auVar30._4_12_ = auVar29._4_12_;
        auVar30._0_4_ = iVar13;
        iVar13 = 4;
        do {
          uVar14 = auVar30._0_4_;
          auVar31._4_4_ = auVar30._4_4_;
          uVar37 = auVar30._8_4_;
          auVar31._12_4_ = auVar30._12_4_;
          iVar27 = uVar14 * 10;
          iVar6 = uVar37 * 10;
          auVar31._0_4_ = auVar31._4_4_;
          auVar31._8_4_ = auVar31._12_4_;
          uVar38 = (undefined4)((auVar31._8_8_ & 0xffffffff) * 10);
          iVar22 = iVar13 + -4;
          iVar21 = (iVar26 + 3U & 0xfffffffc) + iVar13;
          auVar30._4_4_ = auVar31._4_4_ * 10;
          auVar30._0_4_ = iVar27;
          auVar30._8_4_ = iVar6;
          auVar30._12_4_ = uVar38;
          iVar13 = iVar22;
        } while (iVar21 != 8);
        uVar23 = -iVar22;
        auVar32._0_4_ = -(uint)((int)(uVar25 ^ 0x80000000) < (int)(uVar23 ^ 0x80000000));
        auVar32._4_4_ = -(uint)((int)(uVar25 ^ 0x80000000) < (int)((uVar23 | 1) ^ 0x80000000));
        auVar32._8_4_ = -(uint)((int)(uVar25 ^ 0x80000000) < (int)((uVar23 | 2) ^ 0x80000000));
        auVar32._12_4_ = -(uint)((int)(uVar25 ^ 0x80000000) < (int)((uVar23 | 3) ^ 0x80000000));
        auVar4._4_4_ = auVar31._4_4_ * 10;
        auVar4._0_4_ = iVar27;
        auVar4._8_4_ = iVar6;
        auVar4._12_4_ = uVar38;
        in_XMM3._4_4_ = auVar31._4_4_ & auVar32._4_4_;
        in_XMM3._0_4_ = uVar14 & auVar32._0_4_;
        in_XMM3._8_4_ = uVar37 & auVar32._8_4_;
        in_XMM3._12_4_ = auVar31._12_4_ & auVar32._12_4_;
        in_XMM3 = ~auVar32 & auVar4 | in_XMM3;
        iVar13 = in_XMM3._8_4_ * in_XMM3._0_4_ * in_XMM3._4_4_ * in_XMM3._12_4_;
      }
      uVar14 = iVar13 / iVar20;
      uVar25 = 0;
      local_130 = uVar16;
      if (2 < (int)uVar14) {
        copy_val(dvs_ext2,dvs_ext,0);
        mul_by_long(dvs_ext2,(ulong)uVar14);
        compute_abs_diff_into(rem_ext2,rem_ext,dvs_ext2);
        pcVar15 = rem_ext;
        if ((rem_ext2[4] & 8U) != 0) {
          if (local_148 != (ushort *)0x0) goto LAB_0026b7e9;
          goto LAB_0026b814;
        }
        rem_ext = rem_ext2;
        rem_ext2 = pcVar15;
        uVar25 = uVar14;
      }
      pcVar18 = dvs_ext;
      pcVar15 = rem_ext;
      uVar14 = compare_abs(rem_ext,dvs_ext);
      if ((int)uVar14 < 0) {
        uVar37 = 1;
      }
      else {
        do {
          if (uVar14 == 0) {
            uVar14 = 0;
            uVar25 = uVar25 + 1;
            uVar37 = uVar14;
            goto LAB_0026b69b;
          }
          compute_abs_diff_into(rem_ext2,pcVar15,pcVar18);
          pcVar18 = dvs_ext;
          pcVar15 = rem_ext2;
          pcVar9 = rem_ext;
          rem_ext = rem_ext2;
          rem_ext2 = pcVar9;
          uVar25 = uVar25 + 1;
          uVar14 = compare_abs(pcVar15,dvs_ext);
        } while (-1 < (int)uVar14);
        uVar37 = 1;
      }
LAB_0026b69b:
      puVar17 = local_120;
      if (local_130 < local_118) {
        bVar19 = (byte)local_130 & 1;
        *(byte *)((long)local_120 + (local_130 >> 1) + 5) =
             (byte)((uVar25 & 0xf) << (bVar19 * '\x04' ^ 4)) |
             '\x0f' << (bVar19 << 2) & *(byte *)((long)local_120 + (local_130 >> 1) + 5);
      }
      else if (local_130 == local_118) {
        local_120[1] = (ushort)iVar12;
        round_for_dropped_digits((char *)local_120,uVar25,uVar14 >> 0x1f);
        goto LAB_0026b7a9;
      }
      if (uVar25 != 0) {
        uVar28 = 1;
      }
      iVar20 = (int)uVar28;
      uVar16 = (iVar20 != 0) + local_130;
      iVar12 = iVar12 - (uint)(iVar20 == 0);
      if (((char)uVar37 == '\0') ||
         ((local_148 != (ushort *)0x0 && ((uVar16 == local_118 || (iVar12 == (int)uVar16))))))
      goto LAB_0026b747;
      *(short *)(pcVar18 + 2) = *(short *)(pcVar18 + 2) + -1;
      uVar14 = (uint)local_172;
    } while( true );
  }
  copy_val(new_rem_ext,rem_ext,1);
  puVar17[1] = 1;
  *(byte *)(puVar17 + 2) = (byte)puVar17[2] & 0xf0 | 8;
  memset((void *)((long)puVar17 + 5),0,(ulong)(*puVar17 + 1 >> 1));
LAB_0026b839:
  release_temp_regs(4,(ulong)rem_hdl,(ulong)rem_hdl2,(ulong)dvs_hdl,(ulong)dvs_hdl2);
  return;
LAB_0026b747:
  if (uVar16 < local_118) {
    bVar19 = (((byte)local_130 + 1) - (iVar20 == 0)) * '\x04';
    do {
      pbVar1 = (byte *)((long)local_120 + (uVar16 >> 1) + 5);
      *pbVar1 = *pbVar1 & '\x0f' << (bVar19 & 4);
      uVar16 = uVar16 + 1;
      bVar19 = bVar19 + 4;
    } while (uVar16 < local_118);
  }
  local_120[1] = (ushort)iVar12;
LAB_0026b7a9:
  ext = local_148;
  if (local_148 != (ushort *)0x0) {
    if ((char)uVar37 == '\0') {
LAB_0026b7e9:
      local_148[1] = 1;
      *(byte *)(local_148 + 2) = (byte)local_148[2] & 0xf0 | 8;
      memset((void *)((long)local_148 + 5),0,(ulong)(*local_148 + 1 >> 1));
    }
    else {
      copy_val((char *)local_148,pcVar15,1);
      *(byte *)(ext + 2) = (byte)ext[2] & 0xfe | local_150[4] & 1U;
      normalize((char *)ext);
    }
  }
LAB_0026b814:
  *(byte *)(puVar17 + 2) = (byte)puVar17[2] & 0xfe | (local_128[4] ^ local_150[4]) & 1U;
  normalize((char *)puVar17);
  goto LAB_0026b839;
}

Assistant:

void CVmObjBigNum::compute_quotient_into(char *new_ext,
                                         char *new_rem_ext,
                                         const char *ext1, const char *ext2)
{
    char *rem_ext;
    uint rem_hdl;
    char *rem_ext2;
    uint rem_hdl2;
    int quo_exp;
    size_t quo_idx;
    size_t quo_prec = get_prec(new_ext);
    size_t dvd_prec = get_prec(ext1);
    size_t dvs_prec = get_prec(ext2);
    char *dvs_ext;
    uint dvs_hdl;
    char *dvs_ext2;
    uint dvs_hdl2;
    int lead_dig_set;
    int zero_remainder;
    int acc;
    size_t rem_prec;

    /* if the divisor is zero, throw an error */
    if (is_zero(ext2))
        err_throw(VMERR_DIVIDE_BY_ZERO);

    /* if the dividend is zero, the result is zero */
    if (is_zero(ext1))
    {
        /* set the result to zero */
        set_zero(new_ext);

        /* if they want the remainder, it's zero also */
        if (new_rem_ext != 0)
            set_zero(new_rem_ext);

        /* we're done */
        return;
    }

    /* 
     *   Calculate the precision we need for the running remainder.  We
     *   must retain enough precision in the remainder to calculate exact
     *   differences, so we need the greater of the precisions of the
     *   dividend and the divisor, plus enough extra digits for the
     *   maximum relative shifting.  We'll have to shift at most one
     *   extra digit, but use two to be extra safe.  
     */
    rem_prec = dvd_prec;
    if (rem_prec < dvs_prec)
        rem_prec = dvs_prec;
    rem_prec += 2;

    /*   
     *   Make sure the precision is at least three, since it simplifies
     *   our digit approximation calculation.  
     */
    if (rem_prec < 3)
        rem_prec = 3;

    /* 
     *   Allocate two temporary registers for the running remainder, and
     *   one more for the multiplied divisor.  Note that we allocate the
     *   multiplied divisor at our higher precision so that we don't lose
     *   digits in our multiplier calculations.  
     */
    alloc_temp_regs(rem_prec, 3,
                    &rem_ext, &rem_hdl, &rem_ext2, &rem_hdl2,
                    &dvs_ext2, &dvs_hdl2);

    /* 
     *   Allocate another temp register for the shifted divisor.  Note
     *   that we need a different precision here, which is why we must
     *   make a separate allocation call 
     */
    err_try
    {
        /* make the additional allocation */
        alloc_temp_regs(dvs_prec, 1, &dvs_ext, &dvs_hdl);
    }